

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_files.h
# Opt level: O0

int cf_read_file(cf_dir_t *dir,cf_file_t *file)

{
  int iVar1;
  char *fname;
  char *dname;
  char *dpath;
  char *fpath;
  int n;
  cf_file_t *file_local;
  cf_dir_t *dir_local;
  
  if (dir->entry == (dirent *)0x0) {
    __assert_fail("dir->entry",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
                  ,0x177,"int cf_read_file(cf_dir_t *, cf_file_t *)");
  }
  iVar1 = cf_safe_strcpy_internal
                    (file->path,dir->path,0,0x400,
                     "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
                     ,0x17d);
  iVar1 = cf_safe_strcpy_internal
                    (file->path,"/",iVar1 + -1,0x400,
                     "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
                     ,0x17e);
  cf_safe_strcpy_internal
            (file->name,dir->entry->d_name,0,0x100,
             "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
             ,0x183);
  cf_safe_strcpy_internal
            (file->path,file->name,iVar1 + -1,0x400,
             "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/libs/cute/cute_files.h"
             ,0x184);
  iVar1 = stat(file->path,(stat *)&file->info);
  if (iVar1 == 0) {
    file->size = (int)(file->info).st_size;
    cf_get_ext(file);
    file->is_dir = (uint)(((file->info).st_mode & 0xf000) == 0x4000);
    file->is_reg = (uint)(((file->info).st_mode & 0xf000) == 0x8000);
  }
  dir_local._4_4_ = (uint)(iVar1 == 0);
  return dir_local._4_4_;
}

Assistant:

int cf_read_file(cf_dir_t* dir, cf_file_t* file)
	{
		CUTE_FILES_ASSERT(dir->entry);

		int n = 0;
		char* fpath = file->path;
		char* dpath = dir->path;

		n = cf_safe_strcpy(fpath, dpath, 0, CUTE_FILES_MAX_PATH);
		n = cf_safe_strcpy(fpath, "/", n - 1, CUTE_FILES_MAX_PATH);

		char* dname = dir->entry->d_name;
		char* fname = file->name;

		cf_safe_strcpy(fname, dname, 0, CUTE_FILES_MAX_FILENAME);
		cf_safe_strcpy(fpath, fname, n - 1, CUTE_FILES_MAX_PATH);

		if (stat(file->path, &file->info))
			return 0;

		file->size = file->info.st_size;
		cf_get_ext(file);

		file->is_dir = S_ISDIR(file->info.st_mode);
		file->is_reg = S_ISREG(file->info.st_mode);

		return 1;
	}